

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator>::PrimitiveDictionary
          (PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator> *this,
          Allocator *allocator_p,idx_t maximum_size_p,idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  primitive_dictionary_entry_t *ppVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  data_ptr_t pdVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  uVar4 = NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = uVar4;
  this->capacity_mask = uVar4 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  pAVar1 = this->allocator;
  pdVar5 = Allocator::AllocateData(pAVar1,uVar4 * 8);
  AllocatedData::AllocatedData(&this->allocated_dictionary,pAVar1,pdVar5,uVar4 * 8);
  pAVar1 = this->allocator;
  iVar8 = this->capacity << 2;
  pdVar5 = Allocator::AllocateData(pAVar1,iVar8);
  AllocatedData::AllocatedData(&this->allocated_target,pAVar1,pdVar5,iVar8);
  MemoryStream::MemoryStream
            (&this->target_stream,(this->allocated_target).pointer,
             (this->allocated_target).allocated_size);
  iVar8 = this->capacity;
  ppVar2 = (primitive_dictionary_entry_t *)(this->allocated_dictionary).pointer;
  this->dictionary = ppVar2;
  this->full = false;
  auVar3 = _DAT_01d99b10;
  if (iVar8 != 0) {
    lVar6 = iVar8 - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_01d99b10;
    auVar11 = _DAT_01d9abd0;
    auVar12 = _DAT_01d99b00;
    do {
      auVar13 = auVar12 ^ auVar3;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar10 && auVar9._0_4_ < auVar13._0_4_ || iVar10 < auVar13._4_4_
                  ) & 1)) {
        ppVar2[uVar7].index = 0xffffffff;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        ppVar2[uVar7 + 1].index = 0xffffffff;
      }
      auVar13 = auVar11 ^ auVar3;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar13._0_4_ <= auVar9._0_4_)) {
        ppVar2[uVar7 + 2].index = 0xffffffff;
        ppVar2[uVar7 + 3].index = 0xffffffff;
      }
      uVar7 = uVar7 + 4;
      lVar6 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar6 + 4;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar6 + 4;
    } while ((iVar8 + 3 & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}